

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3)

{
  size_t sVar1;
  long lVar2;
  size_t size;
  char *pcVar3;
  long local_50 [4];
  
  local_50[0] = *(long *)(this + 8);
  local_50[1] = 1;
  local_50[2] = *(undefined8 *)(params_1 + 8);
  local_50[3] = params_2->size_;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_50 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  heapString(__return_storage_ptr__,size);
  pcVar3 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(pcVar3,*(void **)this,sVar1);
    pcVar3 = pcVar3 + sVar1;
  }
  *pcVar3 = *(char *)&params->ptr;
  pcVar3 = pcVar3 + 1;
  sVar1 = *(size_t *)(params_1 + 8);
  if (sVar1 != 0) {
    memcpy(pcVar3,*(void **)params_1,sVar1);
    pcVar3 = pcVar3 + sVar1;
  }
  if (params_2->size_ != 0) {
    memcpy(pcVar3,params_2->ptr,params_2->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}